

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestCommentInjectionMessage::~TestCommentInjectionMessage
          (TestCommentInjectionMessage *this)

{
  TestCommentInjectionMessage *this_local;
  
  ~TestCommentInjectionMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestCommentInjectionMessage::~TestCommentInjectionMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestCommentInjectionMessage)
  SharedDtor(*this);
}